

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool ParameterTraits<std::pair<int,_int>_>::convert(string *v,RepType *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_91;
  string local_90;
  StringTokenizer tokenizer;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90," ;,\t\n\r",&local_91);
  OpenMD::StringTokenizer::StringTokenizer(&tokenizer,v,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  iVar1 = OpenMD::StringTokenizer::countTokens(&tokenizer);
  if (iVar1 == 2) {
    iVar2 = OpenMD::StringTokenizer::nextTokenAsInt(&tokenizer);
    iVar3 = OpenMD::StringTokenizer::nextTokenAsInt(&tokenizer);
    r->first = iVar2;
    r->second = iVar3;
  }
  else {
    memcpy(&painCave,"ParameterManager Error: Incorrect number of tokens to make a pair!\n",0x44);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  OpenMD::StringTokenizer::~StringTokenizer(&tokenizer);
  return iVar1 == 2;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::StringTokenizer tokenizer(v, " ;,\t\n\r");
    if (tokenizer.countTokens() == 2) {
      int atom1 = tokenizer.nextTokenAsInt();
      int atom2 = tokenizer.nextTokenAsInt();
      r         = std::make_pair(atom1, atom2);
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ParameterManager Error: "
               "Incorrect number of tokens to make a pair!\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    return false;
  }